

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O1

CURLcode dohprobe(Curl_easy *data,dnsprobe *p,DNStype dnstype,char *host,char *url,CURLM *multi,
                 curl_slist *headers)

{
  FILE *pFVar1;
  Curl_easy *pCVar2;
  CURLcode CVar3;
  CURLMcode CVar4;
  size_t sVar5;
  char *pcVar6;
  timediff_t tVar7;
  undefined8 uVar8;
  uchar *puVar9;
  dynbuf *resp;
  bool bVar10;
  Curl_easy *local_60;
  Curl_easy *local_58;
  DNStype local_4c;
  uchar *local_48;
  CURLM *local_40;
  char *local_38;
  
  local_60 = (Curl_easy *)0x0;
  local_48 = p->dohbuffer;
  local_4c = dnstype;
  local_40 = multi;
  local_38 = url;
  sVar5 = strlen(host);
  if ((sVar5 - (host[sVar5 - 1] == '.')) + 0x12 < 0x111) {
    p->dohbuffer[0] = '\0';
    p->dohbuffer[1] = '\0';
    p->dohbuffer[2] = '\x01';
    p->dohbuffer[3] = '\0';
    p->dohbuffer[4] = '\0';
    p->dohbuffer[5] = '\x01';
    puVar9 = p->dohbuffer + 0xc;
    p->dohbuffer[6] = '\0';
    p->dohbuffer[7] = '\0';
    p->dohbuffer[8] = '\0';
    p->dohbuffer[9] = '\0';
    p->dohbuffer[10] = '\0';
    p->dohbuffer[0xb] = '\0';
    local_58 = data;
    for (; *host != '\0'; host = host + ((sVar5 + 1) - (ulong)(pcVar6 == (char *)0x0))) {
      pcVar6 = strchr(host,0x2e);
      if (pcVar6 == (char *)0x0) {
        sVar5 = strlen(host);
      }
      else {
        sVar5 = (long)pcVar6 - (long)host;
      }
      if (0x3e < sVar5 - 1) {
        p->dohlen = 0;
        uVar8 = 1;
        bVar10 = false;
        data = local_58;
        goto LAB_00148ebc;
      }
      *puVar9 = (uchar)sVar5;
      memcpy(puVar9 + 1,host,sVar5);
      puVar9 = puVar9 + sVar5 + 1;
    }
    puVar9[0] = '\0';
    puVar9[1] = '\0';
    puVar9[2] = (uchar)local_4c;
    puVar9[3] = '\0';
    puVar9[4] = '\x01';
    p->dohlen = (size_t)(puVar9 + (5 - (long)local_48));
    uVar8 = 0;
    bVar10 = true;
    data = local_58;
  }
  else {
    uVar8 = 0xd;
    bVar10 = false;
  }
LAB_00148ebc:
  if (!bVar10) {
    Curl_failf(data,"Failed to encode DoH packet [%d]",uVar8);
    return CURLE_OUT_OF_MEMORY;
  }
  p->dnstype = local_4c;
  Curl_dyn_init(&p->serverdoh,3000);
  tVar7 = Curl_timeleft(data,(curltime *)0x0,true);
  if (tVar7 < 1) {
    CVar3 = CURLE_OPERATION_TIMEDOUT;
    goto LAB_00149585;
  }
  CVar3 = Curl_open(&local_60);
  if (CVar3 != CURLE_OK) goto LAB_00149585;
  CVar3 = curl_easy_setopt(local_60,CURLOPT_URL,local_38);
  bVar10 = false;
  if ((CVar3 < CURLE_SETOPT_OPTION_SYNTAX) &&
     (local_58 = data, bVar10 = false, (0x1000000000011U >> ((ulong)CVar3 & 0x3f) & 1) != 0)) {
    bVar10 = false;
    CVar3 = curl_easy_setopt(local_60,CURLOPT_DEFAULT_PROTOCOL,"https");
    if ((CVar3 < CURLE_SETOPT_OPTION_SYNTAX) &&
       ((0x1000000000011U >> ((ulong)CVar3 & 0x3f) & 1) != 0)) {
      bVar10 = false;
      CVar3 = curl_easy_setopt(local_60,CURLOPT_WRITEFUNCTION,doh_write_cb);
      if ((CVar3 < CURLE_SETOPT_OPTION_SYNTAX) &&
         ((0x1000000000011U >> ((ulong)CVar3 & 0x3f) & 1) != 0)) {
        bVar10 = false;
        CVar3 = curl_easy_setopt(local_60,CURLOPT_WRITEDATA,&p->serverdoh);
        if ((CVar3 < CURLE_SETOPT_OPTION_SYNTAX) &&
           ((0x1000000000011U >> ((ulong)CVar3 & 0x3f) & 1) != 0)) {
          bVar10 = false;
          CVar3 = curl_easy_setopt(local_60,CURLOPT_POSTFIELDS,local_48);
          if ((CVar3 < CURLE_SETOPT_OPTION_SYNTAX) &&
             ((0x1000000000011U >> ((ulong)CVar3 & 0x3f) & 1) != 0)) {
            bVar10 = false;
            CVar3 = curl_easy_setopt(local_60,CURLOPT_POSTFIELDSIZE,p->dohlen);
            if ((CVar3 < CURLE_SETOPT_OPTION_SYNTAX) &&
               ((0x1000000000011U >> ((ulong)CVar3 & 0x3f) & 1) != 0)) {
              bVar10 = false;
              CVar3 = curl_easy_setopt(local_60,CURLOPT_HTTPHEADER,headers);
              if ((CVar3 < CURLE_SETOPT_OPTION_SYNTAX) &&
                 ((0x1000000000011U >> ((ulong)CVar3 & 0x3f) & 1) != 0)) {
                bVar10 = false;
                CVar3 = curl_easy_setopt(local_60,CURLOPT_HTTP_VERSION,4);
                if ((CVar3 < CURLE_SETOPT_OPTION_SYNTAX) &&
                   ((0x1000000000011U >> ((ulong)CVar3 & 0x3f) & 1) != 0)) {
                  bVar10 = false;
                  CVar3 = curl_easy_setopt(local_60,CURLOPT_PROTOCOLS,2);
                  if ((CVar3 < CURLE_SETOPT_OPTION_SYNTAX) &&
                     ((0x1000000000011U >> ((ulong)CVar3 & 0x3f) & 1) != 0)) {
                    bVar10 = false;
                    CVar3 = curl_easy_setopt(local_60,CURLOPT_TIMEOUT_MS,tVar7);
                    if ((CVar3 < CURLE_SETOPT_OPTION_SYNTAX) &&
                       ((0x1000000000011U >> ((ulong)CVar3 & 0x3f) & 1) != 0)) {
                      bVar10 = false;
                      CVar3 = curl_easy_setopt(local_60,CURLOPT_SHARE,local_58->share);
                      if ((CVar3 < CURLE_SETOPT_OPTION_SYNTAX) &&
                         ((0x1000000000011U >> ((ulong)CVar3 & 0x3f) & 1) != 0)) {
                        pFVar1 = (local_58->set).err;
                        if ((pFVar1 != (FILE *)0x0) && (pFVar1 != _stderr)) {
                          bVar10 = false;
                          CVar3 = curl_easy_setopt(local_60,CURLOPT_STDERR);
                          if ((CURLE_UNKNOWN_OPTION < CVar3) ||
                             ((0x1000000000011U >> ((ulong)CVar3 & 0x3f) & 1) == 0))
                          goto LAB_00149551;
                        }
                        if (((local_58->set).field_0x8e5 & 8) != 0) {
                          bVar10 = false;
                          CVar3 = curl_easy_setopt(local_60,CURLOPT_VERBOSE,1);
                          if ((CURLE_UNKNOWN_OPTION < CVar3) ||
                             ((0x1000000000011U >> ((ulong)CVar3 & 0x3f) & 1) == 0))
                          goto LAB_00149551;
                        }
                        if (((local_58->set).field_0x8e5 & 0x80) != 0) {
                          bVar10 = false;
                          CVar3 = curl_easy_setopt(local_60,CURLOPT_NOSIGNAL,1);
                          if ((CURLE_UNKNOWN_OPTION < CVar3) ||
                             ((0x1000000000011U >> ((ulong)CVar3 & 0x3f) & 1) == 0))
                          goto LAB_00149551;
                        }
                        bVar10 = false;
                        CVar3 = curl_easy_setopt(local_60,CURLOPT_SSL_VERIFYHOST,
                                                 (ulong)((uint)((ulong)*(undefined8 *)
                                                                        &(local_58->set).field_0x8e2
                                                               >> 0x32) & 2));
                        if ((CVar3 < CURLE_SETOPT_OPTION_SYNTAX) &&
                           ((0x1000000000011U >> ((ulong)CVar3 & 0x3f) & 1) != 0)) {
                          bVar10 = false;
                          CVar3 = curl_easy_setopt(local_60,CURLOPT_SSL_VERIFYPEER,
                                                   (ulong)((uint)((ulong)*(undefined8 *)
                                                                          &(local_58->set).
                                                                           field_0x8e2 >> 0x32) & 1)
                                                  );
                          if ((CVar3 < CURLE_SETOPT_OPTION_SYNTAX) &&
                             ((0x1000000000011U >> ((ulong)CVar3 & 0x3f) & 1) != 0)) {
                            bVar10 = false;
                            CVar3 = curl_easy_setopt(local_60,CURLOPT_SSL_VERIFYSTATUS,
                                                     (ulong)((uint)((ulong)*(undefined8 *)
                                                                            &(local_58->set).
                                                                             field_0x8e2 >> 0x34) &
                                                            1));
                            if ((CVar3 < CURLE_SETOPT_OPTION_SYNTAX) &&
                               ((0x1000000000011U >> ((ulong)CVar3 & 0x3f) & 1) != 0)) {
                              if (((local_58->set).ssl.field_0xb8 & 2) != 0) {
                                bVar10 = false;
                                CVar3 = curl_easy_setopt(local_60,CURLOPT_SSL_FALSESTART,1);
                                if ((CURLE_UNKNOWN_OPTION < CVar3) ||
                                   ((0x1000000000011U >> ((ulong)CVar3 & 0x3f) & 1) == 0))
                                goto LAB_00149551;
                              }
                              if ((local_58->set).str[0x1c] != (char *)0x0) {
                                bVar10 = false;
                                CVar3 = curl_easy_setopt(local_60,CURLOPT_CAINFO);
                                if ((CURLE_UNKNOWN_OPTION < CVar3) ||
                                   ((0x1000000000011U >> ((ulong)CVar3 & 0x3f) & 1) == 0))
                                goto LAB_00149551;
                              }
                              if ((local_58->set).blobs[6] != (curl_blob *)0x0) {
                                bVar10 = false;
                                CVar3 = curl_easy_setopt(local_60,CURLOPT_CAINFO_BLOB);
                                if ((CURLE_UNKNOWN_OPTION < CVar3) ||
                                   ((0x1000000000011U >> ((ulong)CVar3 & 0x3f) & 1) == 0))
                                goto LAB_00149551;
                              }
                              if ((local_58->set).str[0x1a] != (char *)0x0) {
                                bVar10 = false;
                                CVar3 = curl_easy_setopt(local_60,CURLOPT_CAPATH);
                                if ((CURLE_UNKNOWN_OPTION < CVar3) ||
                                   ((0x1000000000011U >> ((ulong)CVar3 & 0x3f) & 1) == 0))
                                goto LAB_00149551;
                              }
                              if ((local_58->set).str[0x25] != (char *)0x0) {
                                bVar10 = false;
                                CVar3 = curl_easy_setopt(local_60,CURLOPT_CRLFILE);
                                if ((CURLE_UNKNOWN_OPTION < CVar3) ||
                                   ((0x1000000000011U >> ((ulong)CVar3 & 0x3f) & 1) == 0))
                                goto LAB_00149551;
                              }
                              if (((local_58->set).ssl.field_0xb8 & 1) != 0) {
                                bVar10 = false;
                                CVar3 = curl_easy_setopt(local_60,CURLOPT_CERTINFO,1);
                                if ((CURLE_UNKNOWN_OPTION < CVar3) ||
                                   ((0x1000000000011U >> ((ulong)CVar3 & 0x3f) & 1) == 0))
                                goto LAB_00149551;
                              }
                              if ((local_58->set).ssl.fsslctx != (curl_ssl_ctx_callback)0x0) {
                                bVar10 = false;
                                CVar3 = curl_easy_setopt(local_60,CURLOPT_SSL_CTX_FUNCTION);
                                if ((CURLE_UNKNOWN_OPTION < CVar3) ||
                                   ((0x1000000000011U >> ((ulong)CVar3 & 0x3f) & 1) == 0))
                                goto LAB_00149551;
                              }
                              if ((local_58->set).ssl.fsslctxp != (void *)0x0) {
                                bVar10 = false;
                                CVar3 = curl_easy_setopt(local_60,CURLOPT_SSL_CTX_DATA);
                                if ((CURLE_UNKNOWN_OPTION < CVar3) ||
                                   ((0x1000000000011U >> ((ulong)CVar3 & 0x3f) & 1) == 0))
                                goto LAB_00149551;
                              }
                              if ((local_58->set).str[0x4b] != (char *)0x0) {
                                bVar10 = false;
                                CVar3 = curl_easy_setopt(local_60,CURLOPT_SSL_EC_CURVES);
                                if ((CURLE_UNKNOWN_OPTION < CVar3) ||
                                   ((0x1000000000011U >> ((ulong)CVar3 & 0x3f) & 1) == 0))
                                goto LAB_00149551;
                              }
                              pCVar2 = local_58;
                              curl_easy_setopt(local_60,CURLOPT_SSL_OPTIONS,
                                               (ulong)((byte)(local_58->set).ssl.field_0xb8 >> 2));
                              (local_60->set).fmultidone = doh_done;
                              (local_60->set).dohfor = pCVar2;
                              p->easy = local_60;
                              CVar4 = curl_multi_add_handle(local_40,local_60);
                              bVar10 = CVar4 == CURLM_OK;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_00149551:
  if (bVar10) {
    (*Curl_cfree)((void *)0x0);
    return CURLE_OK;
  }
LAB_00149585:
  (*Curl_cfree)((void *)0x0);
  Curl_close(&local_60);
  return CVar3;
}

Assistant:

static CURLcode dohprobe(struct Curl_easy *data,
                         struct dnsprobe *p, DNStype dnstype,
                         const char *host,
                         const char *url, CURLM *multi,
                         struct curl_slist *headers)
{
  struct Curl_easy *doh = NULL;
  char *nurl = NULL;
  CURLcode result = CURLE_OK;
  timediff_t timeout_ms;
  DOHcode d = doh_encode(host, dnstype, p->dohbuffer, sizeof(p->dohbuffer),
                         &p->dohlen);
  if(d) {
    failf(data, "Failed to encode DoH packet [%d]", d);
    return CURLE_OUT_OF_MEMORY;
  }

  p->dnstype = dnstype;
  Curl_dyn_init(&p->serverdoh, DYN_DOH_RESPONSE);

  timeout_ms = Curl_timeleft(data, NULL, TRUE);
  if(timeout_ms <= 0) {
    result = CURLE_OPERATION_TIMEDOUT;
    goto error;
  }
  /* Curl_open() is the internal version of curl_easy_init() */
  result = Curl_open(&doh);
  if(!result) {
    /* pass in the struct pointer via a local variable to please coverity and
       the gcc typecheck helpers */
    struct dynbuf *resp = &p->serverdoh;
    ERROR_CHECK_SETOPT(CURLOPT_URL, url);
    ERROR_CHECK_SETOPT(CURLOPT_DEFAULT_PROTOCOL, "https");
    ERROR_CHECK_SETOPT(CURLOPT_WRITEFUNCTION, doh_write_cb);
    ERROR_CHECK_SETOPT(CURLOPT_WRITEDATA, resp);
    ERROR_CHECK_SETOPT(CURLOPT_POSTFIELDS, p->dohbuffer);
    ERROR_CHECK_SETOPT(CURLOPT_POSTFIELDSIZE, (long)p->dohlen);
    ERROR_CHECK_SETOPT(CURLOPT_HTTPHEADER, headers);
#ifdef USE_HTTP2
    ERROR_CHECK_SETOPT(CURLOPT_HTTP_VERSION, CURL_HTTP_VERSION_2TLS);
#endif
#ifndef CURLDEBUG
    /* enforce HTTPS if not debug */
    ERROR_CHECK_SETOPT(CURLOPT_PROTOCOLS, CURLPROTO_HTTPS);
#else
    /* in debug mode, also allow http */
    ERROR_CHECK_SETOPT(CURLOPT_PROTOCOLS, CURLPROTO_HTTP|CURLPROTO_HTTPS);
#endif
    ERROR_CHECK_SETOPT(CURLOPT_TIMEOUT_MS, (long)timeout_ms);
    ERROR_CHECK_SETOPT(CURLOPT_SHARE, data->share);
    if(data->set.err && data->set.err != stderr)
      ERROR_CHECK_SETOPT(CURLOPT_STDERR, data->set.err);
    if(data->set.verbose)
      ERROR_CHECK_SETOPT(CURLOPT_VERBOSE, 1L);
    if(data->set.no_signal)
      ERROR_CHECK_SETOPT(CURLOPT_NOSIGNAL, 1L);

    ERROR_CHECK_SETOPT(CURLOPT_SSL_VERIFYHOST,
      data->set.doh_verifyhost ? 2L : 0L);
    ERROR_CHECK_SETOPT(CURLOPT_SSL_VERIFYPEER,
      data->set.doh_verifypeer ? 1L : 0L);
    ERROR_CHECK_SETOPT(CURLOPT_SSL_VERIFYSTATUS,
      data->set.doh_verifystatus ? 1L : 0L);

    /* Inherit *some* SSL options from the user's transfer. This is a
       best-guess as to which options are needed for compatibility. #3661

       Note DoH does not inherit the user's proxy server so proxy SSL settings
       have no effect and are not inherited. If that changes then two new
       options should be added to check doh proxy insecure separately,
       CURLOPT_DOH_PROXY_SSL_VERIFYHOST and CURLOPT_DOH_PROXY_SSL_VERIFYPEER.
       */
    if(data->set.ssl.falsestart)
      ERROR_CHECK_SETOPT(CURLOPT_SSL_FALSESTART, 1L);
    if(data->set.str[STRING_SSL_CAFILE]) {
      ERROR_CHECK_SETOPT(CURLOPT_CAINFO,
                         data->set.str[STRING_SSL_CAFILE]);
    }
    if(data->set.blobs[BLOB_CAINFO]) {
      ERROR_CHECK_SETOPT(CURLOPT_CAINFO_BLOB,
                         data->set.blobs[BLOB_CAINFO]);
    }
    if(data->set.str[STRING_SSL_CAPATH]) {
      ERROR_CHECK_SETOPT(CURLOPT_CAPATH,
                         data->set.str[STRING_SSL_CAPATH]);
    }
    if(data->set.str[STRING_SSL_CRLFILE]) {
      ERROR_CHECK_SETOPT(CURLOPT_CRLFILE,
                         data->set.str[STRING_SSL_CRLFILE]);
    }
    if(data->set.ssl.certinfo)
      ERROR_CHECK_SETOPT(CURLOPT_CERTINFO, 1L);
    if(data->set.ssl.fsslctx)
      ERROR_CHECK_SETOPT(CURLOPT_SSL_CTX_FUNCTION, data->set.ssl.fsslctx);
    if(data->set.ssl.fsslctxp)
      ERROR_CHECK_SETOPT(CURLOPT_SSL_CTX_DATA, data->set.ssl.fsslctxp);
    if(data->set.str[STRING_SSL_EC_CURVES]) {
      ERROR_CHECK_SETOPT(CURLOPT_SSL_EC_CURVES,
                         data->set.str[STRING_SSL_EC_CURVES]);
    }

    {
      long mask =
        (data->set.ssl.enable_beast ?
         CURLSSLOPT_ALLOW_BEAST : 0) |
        (data->set.ssl.no_revoke ?
         CURLSSLOPT_NO_REVOKE : 0) |
        (data->set.ssl.no_partialchain ?
         CURLSSLOPT_NO_PARTIALCHAIN : 0) |
        (data->set.ssl.revoke_best_effort ?
         CURLSSLOPT_REVOKE_BEST_EFFORT : 0) |
        (data->set.ssl.native_ca_store ?
         CURLSSLOPT_NATIVE_CA : 0) |
        (data->set.ssl.auto_client_cert ?
         CURLSSLOPT_AUTO_CLIENT_CERT : 0);

      (void)curl_easy_setopt(doh, CURLOPT_SSL_OPTIONS, mask);
    }

    doh->set.fmultidone = doh_done;
    doh->set.dohfor = data; /* identify for which transfer this is done */
    p->easy = doh;

    /* DoH private_data must be null because the user must have a way to
       distinguish their transfer's handle from DoH handles in user
       callbacks (ie SSL CTX callback). */
    DEBUGASSERT(!doh->set.private_data);

    if(curl_multi_add_handle(multi, doh))
      goto error;
  }
  else
    goto error;
  free(nurl);
  return CURLE_OK;

  error:
  free(nurl);
  Curl_close(&doh);
  return result;
}